

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O3

int btreeblk_is_writable(void *voidhandle,bid_t bid)

{
  int iVar1;
  btreeblk_handle *handle;
  
  iVar1 = filemgr_is_writable(*(filemgr **)((long)voidhandle + 0x38),
                              (bid & 0xffffffffffff) / (ulong)*(ushort *)((long)voidhandle + 4));
  return iVar1;
}

Assistant:

int btreeblk_is_writable(void *voidhandle, bid_t bid)
{
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;
    bid_t _bid;
    bid_t filebid;
    size_t sb, idx;

    sb = idx = 0;
    subbid2bid(bid, &sb, &idx, &_bid);
    filebid = _bid / handle->nnodeperblock;

    return filemgr_is_writable(handle->file, filebid);
}